

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O3

void __thiscall embree::FastAllocator::share(FastAllocator *this,mvector<PrimRef> *primrefarray_i)

{
  size_t sVar1;
  PrimRef *ptr;
  MemoryMonitorInterface *pMVar2;
  
  sVar1 = (this->primrefarray).size_alloced;
  ptr = (this->primrefarray).items;
  if (ptr != (PrimRef *)0x0) {
    if (sVar1 << 5 < 0x1c00000) {
      alignedFree(ptr);
    }
    else {
      os_free(ptr,sVar1 << 5,(this->primrefarray).alloc.hugepages);
    }
  }
  if (sVar1 != 0) {
    pMVar2 = (this->primrefarray).alloc.device;
    (**pMVar2->_vptr_MemoryMonitorInterface)(pMVar2,sVar1 * -0x20,1);
  }
  (this->primrefarray).size_active = 0;
  (this->primrefarray).size_alloced = 0;
  (this->primrefarray).items = (PrimRef *)0x0;
  (this->primrefarray).alloc.hugepages = (primrefarray_i->alloc).hugepages;
  (this->primrefarray).alloc.device = (primrefarray_i->alloc).device;
  (this->primrefarray).size_active = primrefarray_i->size_active;
  primrefarray_i->size_active = 0;
  (this->primrefarray).size_alloced = primrefarray_i->size_alloced;
  primrefarray_i->size_alloced = 0;
  (this->primrefarray).items = primrefarray_i->items;
  primrefarray_i->items = (PrimRef *)0x0;
  return;
}

Assistant:

void share(mvector<PrimRef>& primrefarray_i) {
      primrefarray = std::move(primrefarray_i);
    }